

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O1

int MD5_Init(MD5_CTX *c)

{
  int in_EAX;
  
  c->C = 0x67452301;
  c->D = 0xefcdab89;
  c->Nl = 0x98badcfe;
  c->Nh = 0x10325476;
  c->A = 0;
  c->B = 0;
  return in_EAX;
}

Assistant:

void MD5_Init(MD5_CTX *ctx)
{
	ctx->a = 0x67452301;
	ctx->b = 0xefcdab89;
	ctx->c = 0x98badcfe;
	ctx->d = 0x10325476;
 
	ctx->lo = 0;
	ctx->hi = 0;
}